

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confidence.cc
# Opt level: O0

void output_and_account_confidence_example(vw *all,example *ec)

{
  float *pfVar1;
  size_t sVar2;
  long in_RSI;
  long *in_RDI;
  int f;
  size_t i;
  label_data *ld;
  float in_stack_000001ec;
  float in_stack_000001f0;
  int in_stack_000001f4;
  v_array<char> in_stack_00000200;
  example *ec_00;
  vw *all_00;
  float local_6c;
  ulong local_40;
  
  pfVar1 = (float *)(in_RSI + 0x6828);
  shared_data::update((shared_data *)*in_RDI,(bool)(*(byte *)(in_RSI + 0x68c8) & 1),
                      *pfVar1 != 3.4028235e+38,*(float *)(in_RSI + 0x68b0),
                      *(float *)(in_RSI + 0x6870),*(size_t *)(in_RSI + 0x68a0));
  if (((*pfVar1 != 3.4028235e+38) || (NAN(*pfVar1))) && ((*(byte *)(in_RSI + 0x68c8) & 1) == 0)) {
    *(double *)(*in_RDI + 0x38) =
         (double)(*pfVar1 * *(float *)(in_RSI + 0x6870)) + *(double *)(*in_RDI + 0x38);
  }
  if ((*pfVar1 != 3.4028235e+38) || (NAN(*pfVar1))) {
    local_6c = 0.0;
  }
  else {
    local_6c = *(float *)(in_RSI + 0x6870);
  }
  *(double *)(*in_RDI + 0x30) = (double)local_6c + *(double *)(*in_RDI + 0x30);
  ec_00 = *(example **)(in_RSI + 0x6878);
  all_00 = *(vw **)(in_RSI + 0x6880);
  (*(code *)in_RDI[0x6a7])(*(undefined4 *)(in_RSI + 0x68a8),0xbf800000,(int)in_RDI[0x6a6]);
  for (local_40 = 0; sVar2 = v_array<int>::size((v_array<int> *)(in_RDI + 0x6a2)), local_40 < sVar2;
      local_40 = local_40 + 1) {
    v_array<int>::operator[]((v_array<int> *)(in_RDI + 0x6a2),local_40);
    ec_00 = *(example **)(in_RSI + 0x6878);
    all_00 = *(vw **)(in_RSI + 0x6880);
    confidence_print_result(in_stack_000001f4,in_stack_000001f0,in_stack_000001ec,in_stack_00000200)
    ;
  }
  print_update(all_00,ec_00);
  return;
}

Assistant:

void output_and_account_confidence_example(vw& all, example& ec)
{
  label_data& ld = ec.l.simple;

  all.sd->update(ec.test_only, ld.label != FLT_MAX, ec.loss, ec.weight, ec.num_features);
  if (ld.label != FLT_MAX && !ec.test_only)
    all.sd->weighted_labels += ld.label * ec.weight;
  all.sd->weighted_unlabeled_examples += ld.label == FLT_MAX ? ec.weight : 0;

  all.print(all.raw_prediction, ec.partial_prediction, -1, ec.tag);
  for (size_t i = 0; i < all.final_prediction_sink.size(); i++)
  {
    int f = (int)all.final_prediction_sink[i];
    confidence_print_result(f, ec.pred.scalar, ec.confidence, ec.tag);
  }

  print_update(all, ec);
}